

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPLinearClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPLinearClause *this)

{
  bool bVar1;
  ulong uVar2;
  string local_b8;
  string local_98;
  string local_78;
  OpenMPLinearClauseModifier local_58;
  byte local_52;
  allocator<char> local_51;
  OpenMPLinearClauseModifier modifier;
  bool flag;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPLinearClause *local_18;
  OpenMPLinearClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPLinearClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"linear ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&modifier,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_52 = 0;
  local_58 = getModifier(this);
  if (local_58 == OMPC_LINEAR_MODIFIER_val) {
    std::__cxx11::string::operator+=((string *)&modifier,"val");
    local_52 = 1;
  }
  else if (local_58 == OMPC_LINEAR_MODIFIER_ref) {
    std::__cxx11::string::operator+=((string *)&modifier,"ref");
    local_52 = 1;
  }
  else if (local_58 == OMPC_LINEAR_MODIFIER_uval) {
    std::__cxx11::string::operator+=((string *)&modifier,"uval");
    local_52 = 1;
  }
  uVar2 = std::__cxx11::string::size();
  if (1 < uVar2) {
    std::__cxx11::string::operator+=((string *)&modifier,"( ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if ((local_52 & 1) == 1) {
    std::__cxx11::string::operator+=((string *)&modifier,") ");
  }
  getUserDefinedStep_abi_cxx11_(&local_98,this);
  bVar1 = std::operator!=(&local_98,"");
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&modifier,":");
    getUserDefinedStep_abi_cxx11_(&local_b8,this);
    std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPLinearClause::toString() {

    std::string result = "linear ";
    std::string clause_string = "(";
    bool flag = false;
    OpenMPLinearClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_LINEAR_MODIFIER_val:
            clause_string += "val";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_ref:
            clause_string += "ref";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_uval:
            clause_string += "uval";
            flag = true;
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += "( ";
    };
    clause_string += this->expressionToString();
    if (flag == true) {
        clause_string += ") ";
    };
    if(this->getUserDefinedStep() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedStep();
    }
    clause_string += ") ";
    result += clause_string;
    return result;
}